

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O3

char * al_keycode_to_name(int keycode)

{
  char *pcVar1;
  
  if ((new_keyboard_driver->keycode_to_name != (_func_char_ptr_int *)0x0) &&
     (pcVar1 = (*new_keyboard_driver->keycode_to_name)(keycode), pcVar1 != (char *)0x0)) {
    return pcVar1;
  }
  return _al_keyboard_common_names[keycode];
}

Assistant:

const char *al_keycode_to_name(int keycode)
{
   const char *name = NULL;

   ASSERT(new_keyboard_driver);
   ASSERT((keycode >= 0) && (keycode < ALLEGRO_KEY_MAX));

   if (new_keyboard_driver->keycode_to_name)
      name = new_keyboard_driver->keycode_to_name(keycode);

   if (!name)
      name = _al_keyboard_common_names[keycode];

   ASSERT(name);

   return name;
}